

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O1

void __thiscall
ot::commissioner::BorderAgent::BorderAgent
          (BorderAgent *this,string *aAddr,uint16_t aPort,ByteArray *aDiscriminator,
          string *aThreadVersion,State aState,string *aNetworkName,uint64_t aExtendedPanId,
          string *aVendorName,string *aModelName,Timestamp aActiveTimestamp,uint32_t aPartitionId,
          string *aVendorData,ByteArray *aVendorOui,string *aDomainName,uint8_t aBbrSeqNumber,
          uint16_t aBbrPort,string *aServiceName,UnixTime aUpdateTimestamp,uint32_t aPresentFlags)

{
  pointer pcVar1;
  
  this->_vptr_BorderAgent = (_func_int **)&PTR__BorderAgent_002b6248;
  (this->mAddr)._M_dataplus._M_p = (pointer)&(this->mAddr).field_2;
  pcVar1 = (aAddr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mAddr,pcVar1,pcVar1 + aAddr->_M_string_length);
  this->mPort = aPort;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->mDiscriminator,aDiscriminator);
  (this->mThreadVersion)._M_dataplus._M_p = (pointer)&(this->mThreadVersion).field_2;
  pcVar1 = (aThreadVersion->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mThreadVersion,pcVar1,pcVar1 + aThreadVersion->_M_string_length);
  this->mState = aState;
  (this->mNetworkName)._M_dataplus._M_p = (pointer)&(this->mNetworkName).field_2;
  pcVar1 = (aNetworkName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mNetworkName,pcVar1,pcVar1 + aNetworkName->_M_string_length);
  this->mExtendedPanId = aExtendedPanId;
  (this->mVendorName)._M_dataplus._M_p = (pointer)&(this->mVendorName).field_2;
  pcVar1 = (aVendorName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mVendorName,pcVar1,pcVar1 + aVendorName->_M_string_length);
  (this->mModelName)._M_dataplus._M_p = (pointer)&(this->mModelName).field_2;
  pcVar1 = (aModelName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mModelName,pcVar1,pcVar1 + aModelName->_M_string_length);
  this->mActiveTimestamp = aActiveTimestamp;
  this->mPartitionId = aPartitionId;
  (this->mVendorData)._M_dataplus._M_p = (pointer)&(this->mVendorData).field_2;
  pcVar1 = (aVendorData->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mVendorData,pcVar1,pcVar1 + aVendorData->_M_string_length);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mVendorOui,aVendorOui);
  (this->mDomainName)._M_dataplus._M_p = (pointer)&(this->mDomainName).field_2;
  pcVar1 = (aDomainName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mDomainName,pcVar1,pcVar1 + aDomainName->_M_string_length);
  this->mBbrSeqNumber = aBbrSeqNumber;
  this->mBbrPort = aBbrPort;
  (this->mServiceName)._M_dataplus._M_p = (pointer)&(this->mServiceName).field_2;
  pcVar1 = (aServiceName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mServiceName,pcVar1,pcVar1 + aServiceName->_M_string_length);
  (this->mUpdateTimestamp).mTime = aUpdateTimestamp.mTime;
  this->mPresentFlags = aPresentFlags;
  return;
}

Assistant:

BorderAgent::BorderAgent(std::string const &aAddr,
                         uint16_t           aPort,
                         ByteArray const   &aDiscriminator,
                         std::string const &aThreadVersion,
                         BorderAgent::State aState,
                         std::string const &aNetworkName,
                         uint64_t           aExtendedPanId,
                         std::string const &aVendorName,
                         std::string const &aModelName,
                         Timestamp          aActiveTimestamp,
                         uint32_t           aPartitionId,
                         std::string const &aVendorData,
                         ByteArray const   &aVendorOui,
                         std::string const &aDomainName,
                         uint8_t            aBbrSeqNumber,
                         uint16_t           aBbrPort,
                         std::string const &aServiceName,
                         UnixTime           aUpdateTimestamp,
                         uint32_t           aPresentFlags)
    : mAddr(aAddr)
    , mPort(aPort)
    , mDiscriminator(aDiscriminator)
    , mThreadVersion(aThreadVersion)
    , mState{aState}
    , mNetworkName(aNetworkName)
    , mExtendedPanId(aExtendedPanId)
    , mVendorName(aVendorName)
    , mModelName(aModelName)
    , mActiveTimestamp{aActiveTimestamp}
    , mPartitionId(aPartitionId)
    , mVendorData(aVendorData)
    , mVendorOui(aVendorOui)
    , mDomainName(aDomainName)
    , mBbrSeqNumber(aBbrSeqNumber)
    , mBbrPort(aBbrPort)
    , mServiceName(aServiceName)
    , mUpdateTimestamp(aUpdateTimestamp)
    , mPresentFlags(aPresentFlags)
{
}